

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O0

size_t ZSTD_compressSuperBlock
                 (ZSTD_CCtx *zc,void *dst,size_t dstCapacity,void *src,size_t srcSize,uint lastBlock
                 )

{
  uint uVar1;
  void *in_stack_00000010;
  ZSTD_CCtx_params *in_stack_00000018;
  ZSTD_entropyCTablesMetadata_t *in_stack_00000020;
  ZSTD_compressedBlockState_t *in_stack_00000028;
  ZSTD_compressedBlockState_t *in_stack_00000030;
  size_t err_code;
  ZSTD_entropyCTablesMetadata_t entropyMetadata;
  void *in_stack_fffffffffffffe90;
  ZSTD_entropyCTablesMetadata_t *in_stack_fffffffffffffe98;
  ZSTD_CCtx_params *in_stack_fffffffffffffea0;
  ZSTD_entropyCTables_t *in_stack_fffffffffffffea8;
  ZSTD_entropyCTables_t *in_stack_fffffffffffffeb0;
  seqStore_t *in_stack_fffffffffffffeb8;
  size_t in_stack_fffffffffffffed0;
  undefined8 local_20;
  
  local_20 = ZSTD_buildBlockEntropyStats
                       (in_stack_fffffffffffffeb8,in_stack_fffffffffffffeb0,
                        in_stack_fffffffffffffea8,in_stack_fffffffffffffea0,
                        in_stack_fffffffffffffe98,in_stack_fffffffffffffe90,
                        in_stack_fffffffffffffed0);
  uVar1 = ERR_isError(local_20);
  if (uVar1 == 0) {
    local_20 = ZSTD_compressSubBlock_multi
                         ((seqStore_t *)err_code,in_stack_00000030,in_stack_00000028,
                          in_stack_00000020,in_stack_00000018,in_stack_00000010,
                          entropyMetadata.hufMetadata.hufDesBuffer._60_8_,
                          (void *)entropyMetadata.hufMetadata.hufDesBuffer._68_8_,
                          entropyMetadata.hufMetadata.hufDesBuffer._76_8_,
                          entropyMetadata.hufMetadata.hufDesBuffer._84_4_,
                          entropyMetadata.hufMetadata.hufDesBuffer._92_4_,
                          (void *)entropyMetadata.hufMetadata.hufDesBuffer._100_8_,
                          entropyMetadata.hufMetadata.hufDesBuffer._108_8_);
  }
  return local_20;
}

Assistant:

size_t ZSTD_compressSuperBlock(ZSTD_CCtx* zc,
                               void* dst, size_t dstCapacity,
                               void const* src, size_t srcSize,
                               unsigned lastBlock) {
    ZSTD_entropyCTablesMetadata_t entropyMetadata;

    FORWARD_IF_ERROR(ZSTD_buildBlockEntropyStats(&zc->seqStore,
          &zc->blockState.prevCBlock->entropy,
          &zc->blockState.nextCBlock->entropy,
          &zc->appliedParams,
          &entropyMetadata,
          zc->entropyWorkspace, ENTROPY_WORKSPACE_SIZE /* statically allocated in resetCCtx */), "");

    return ZSTD_compressSubBlock_multi(&zc->seqStore,
            zc->blockState.prevCBlock,
            zc->blockState.nextCBlock,
            &entropyMetadata,
            &zc->appliedParams,
            dst, dstCapacity,
            src, srcSize,
            zc->bmi2, lastBlock,
            zc->entropyWorkspace, ENTROPY_WORKSPACE_SIZE /* statically allocated in resetCCtx */);
}